

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::detail::
assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  value_view expected_00;
  int in_stack_ffffffffffffffa8;
  quiescent_state_on_scope_exit local_38;
  uint local_34;
  quiescent_state_on_scope_exit qsbr_after_get;
  int line_local;
  char *file_local;
  key_type key_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_local;
  value_view expected_local;
  
  _qsbr_after_get = expected._M_extent._M_extent_value;
  expected_00._M_ptr = expected._M_ptr;
  local_34 = (uint)file;
  local_38.exceptions_at_ctor = 0;
  quiescent_state_on_scope_exit::quiescent_state_on_scope_exit(&local_38);
  expected_00._M_extent._M_extent_value = _qsbr_after_get;
  do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            (this,db,key,expected_00,(char *)(ulong)local_34,in_stack_ffffffffffffffa8);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit(&local_38);
  return;
}

Assistant:

void assert_result_eq(const Db &db, typename Db::key_type key,
                      unodb::value_view expected, const char *file, int line) {
  if constexpr (is_olc_db<Db>) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    do_assert_result_eq<Db>(db, key, expected, file, line);
  } else {
    do_assert_result_eq<Db>(db, key, expected, file, line);
  }
}